

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O3

uint64_t compute_cdef_dist(void *dst,int dstride,uint16_t *src,cdef_list *dlist,int cdef_count,
                          BLOCK_SIZE bsize,int coeff_shift,int row,int col)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  int iVar5;
  uint64_t uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint8_t *puVar10;
  undefined7 in_register_00000089;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  
  uVar11 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar1 = block_size_wide[uVar11];
  uVar8 = (uint)bVar1;
  uVar13 = 0;
  if (cdef_count < 1) {
    uVar11 = 0;
  }
  else {
    bVar2 = block_size_high[uVar11];
    uVar3 = ""[uVar11];
    uVar4 = ""[uVar11];
    iVar5 = (uint)((0x4001cUL >> ((ulong)bsize & 0x3f) & 1) == 0) * 2 + 1;
    uVar11 = 0;
    iVar9 = 0;
    do {
      iVar12 = (int)uVar13;
      puVar10 = (uint8_t *)
                ((long)dst +
                (long)(int)(((uint)dlist[uVar13].bx << (uVar3 + 2 & 0x1f)) +
                           ((uint)dlist[uVar13].by << (uVar4 + 2 & 0x1f)) * dstride) +
                (long)(row * dstride + col));
      if (((iVar5 + iVar9 < cdef_count) && (dlist[uVar13].by == dlist[(uint)(iVar12 + iVar5)].by))
         && ((uint)dlist[uVar13].bx + iVar5 == (uint)dlist[(uint)(iVar12 + iVar5)].bx)) {
        uVar6 = (*aom_mse_16xh_16bit)
                          (puVar10,dstride,src + (iVar12 << (uVar4 + 2 + uVar3 + 2 & 0x1f)),uVar8,
                           (uint)bVar2);
        uVar7 = (uint)(0x10 / bVar1);
      }
      else {
        uVar6 = (*aom_mse_wxh_16bit)
                          (puVar10,dstride,src + (iVar12 << (uVar4 + 2 + uVar3 + 2 & 0x1f)),uVar8,
                           uVar8,(uint)bVar2);
        uVar7 = 1;
      }
      uVar11 = uVar11 + uVar6;
      iVar9 = iVar9 + uVar7;
      uVar13 = (ulong)(iVar12 + uVar7);
    } while ((int)(iVar12 + uVar7) < cdef_count);
  }
  return uVar11 >> ((char)coeff_shift * '\x02' & 0x3fU);
}

Assistant:

static uint64_t compute_cdef_dist(void *dst, int dstride, uint16_t *src,
                                  cdef_list *dlist, int cdef_count,
                                  BLOCK_SIZE bsize, int coeff_shift, int row,
                                  int col) {
  assert(bsize == BLOCK_4X4 || bsize == BLOCK_4X8 || bsize == BLOCK_8X4 ||
         bsize == BLOCK_8X8);
  uint64_t sum = 0;
  int bi, bx, by;
  int iter = 0;
  int inc = 1;
  uint8_t *dst8 = (uint8_t *)dst;
  uint8_t *dst_buff = &dst8[row * dstride + col];
  int src_stride, width, height, width_log2, height_log2;
  init_src_params(&src_stride, &width, &height, &width_log2, &height_log2,
                  bsize);

  const int num_blks = 16 / width;
  for (bi = 0; bi < cdef_count; bi += inc) {
    by = dlist[bi].by;
    bx = dlist[bi].bx;
    uint16_t *src_tmp = &src[bi << (height_log2 + width_log2)];
    uint8_t *dst_tmp =
        &dst_buff[(by << height_log2) * dstride + (bx << width_log2)];

    if (is_dual_or_quad_applicable(dlist, width, cdef_count, bi, iter)) {
      sum += aom_mse_16xh_16bit(dst_tmp, dstride, src_tmp, width, height);
      iter += num_blks;
      inc = num_blks;
    } else {
      sum += aom_mse_wxh_16bit(dst_tmp, dstride, src_tmp, src_stride, width,
                               height);
      iter += 1;
      inc = 1;
    }
  }

  return sum >> 2 * coeff_shift;
}